

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::BindMissShader
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,char *pShaderGroupName,
          Uint32 MissIndex,void *pData,Uint32 DataSize)

{
  Char *pCVar1;
  RenderDeviceVkImpl *this_00;
  GraphicsAdapterInfo *pGVar2;
  unsigned_long *puVar3;
  PipelineStateVkImpl *this_01;
  uchar *puVar4;
  value_type_conflict4 local_a9;
  unsigned_long local_a8;
  size_type local_a0;
  long local_98;
  size_t Offset;
  size_t Stride;
  undefined1 local_80 [4];
  Uint32 GroupSize;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  Uint32 DataSize_local;
  void *pData_local;
  Uint32 MissIndex_local;
  char *pShaderGroupName_local;
  ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = DataSize;
  if ((pData == (void *)0x0) != (DataSize == 0)) {
    FormatString<char[26],char[38]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) == (DataSize == 0)",
               (char (*) [38])(ulong)(DataSize == 0));
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"BindMissShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x9e);
    std::__cxx11::string::~string((string *)local_50);
  }
  if ((pData != (void *)0x0) && (msg.field_2._12_4_ != this->m_ShaderRecordSize)) {
    FormatString<char[26],char[61]>
              ((string *)local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) || (DataSize == this->m_ShaderRecordSize)",
               (char (*) [61])this);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"BindMissShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x9f);
    std::__cxx11::string::~string((string *)local_80);
  }
  this_00 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                       );
  pGVar2 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
  Stride._4_4_ = (pGVar2->RayTracing).ShaderGroupHandleSize;
  Offset = (size_t)this->m_ShaderRecordStride;
  local_98 = MissIndex * Offset;
  local_a0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (&this->m_MissShadersRecord);
  local_a8 = local_98 + Offset;
  puVar3 = std::max<unsigned_long>(&local_a0,&local_a8);
  local_a9 = 0xa7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_MissShadersRecord,*puVar3,&local_a9);
  this_01 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPSO);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&this->m_MissShadersRecord);
  PipelineStateBase<Diligent::EngineVkImplTraits>::CopyShaderHandle
            (&this_01->super_PipelineStateBase<Diligent::EngineVkImplTraits>,pShaderGroupName,
             puVar4 + local_98,Offset);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&this->m_MissShadersRecord);
  memcpy(puVar4 + (ulong)Stride._4_4_ + local_98,pData,(ulong)(uint)msg.field_2._12_4_);
  this->m_Changed = true;
  return;
}

Assistant:

BindMissShader(const char* pShaderGroupName, Uint32 MissIndex, const void* pData, Uint32 DataSize) override final
    {
        VERIFY_EXPR((pData == nullptr) == (DataSize == 0));
        VERIFY_EXPR((pData == nullptr) || (DataSize == this->m_ShaderRecordSize));

        const Uint32 GroupSize = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        const size_t Stride    = this->m_ShaderRecordStride;
        const size_t Offset    = MissIndex * Stride;
        this->m_MissShadersRecord.resize(std::max(this->m_MissShadersRecord.size(), Offset + Stride), Uint8{EmptyElem});

        this->m_pPSO->CopyShaderHandle(pShaderGroupName, this->m_MissShadersRecord.data() + Offset, Stride);
        std::memcpy(this->m_MissShadersRecord.data() + Offset + GroupSize, pData, DataSize);
        this->m_Changed = true;
    }